

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::relative_pose::modules::ge_main2
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  int iVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ostream *poVar4;
  void *pvVar5;
  Scalar *this;
  Scalar *pSVar6;
  Scalar *this_00;
  Scalar *pSVar7;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
  *in_R9;
  bool bVar8;
  double dVar9;
  RealScalar RVar10;
  double dVar11;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_stack_00000008;
  Vector4d t;
  double factor;
  size_t j;
  size_t i;
  Matrix4d V;
  Vector4d D;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  Matrix4d G;
  double ev2;
  double samplingEV;
  cayley_t samplingPoint;
  cayley_t normalizedJacobian;
  double norm;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  double smallestEV;
  int iterations;
  Vector3d disturbance;
  int randomTrialCount;
  bool found;
  double disturbanceAmplitude;
  cayley_t cayley;
  bool print;
  bool disablingIncrements;
  double min_xtol;
  int maxIterations;
  double modifier;
  double maxLambda;
  double lambda;
  Matrix3d *in_stack_000018c0;
  Matrix3d *in_stack_000018c8;
  Matrix3d *in_stack_000018d0;
  Matrix3d *in_stack_000018d8;
  Matrix3d *in_stack_000018e0;
  Matrix3d *in_stack_000018f8;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001900;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001908;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001910;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001918;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001920;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001928;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001930;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001938;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001940;
  cayley_t *in_stack_00001948;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_stack_fffffffffffff3c0;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *this_01;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
  *other;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffff3c8;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *this_02;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *pDVar12;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff3e0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff3e8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar13;
  StorageBaseType *matrix;
  StorageBaseType *matrix_00;
  cayley_t *in_stack_fffffffffffff410;
  undefined4 uVar15;
  double *pdVar14;
  int in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff420;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff428;
  ostream *in_stack_fffffffffffff468;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_stack_fffffffffffff470;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_fffffffffffff478;
  StorageBaseType *in_stack_fffffffffffff480;
  ostream *in_stack_fffffffffffff488;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_stack_fffffffffffff490;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_fffffffffffff498;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_fffffffffffff4d8;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_stack_fffffffffffff4e0;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_fffffffffffff4e8;
  StorageBaseType *in_stack_fffffffffffff4f0;
  Matrix<double,_3,_9,_0,_3,_9> *z2P_00;
  Matrix<double,_9,_9,_0,_9,_9> *m22P_00;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_fffffffffffff510;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_fffffffffffff518;
  cayley_t *in_stack_fffffffffffff520;
  undefined7 in_stack_fffffffffffff528;
  undefined1 uVar16;
  int in_stack_fffffffffffff530;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff560;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *in_stack_fffffffffffff620;
  ostream *in_stack_fffffffffffff628;
  ulong local_9d0;
  ulong local_9c8;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_7c0;
  double local_2f8;
  non_const_type local_2f0;
  non_const_type local_288;
  non_const_type local_220;
  double local_218;
  StorageBaseType local_1b0 [24];
  non_const_type local_198;
  double local_190;
  double local_148;
  double local_140 [3];
  double local_128;
  int local_11c;
  int local_100;
  byte local_f9;
  double local_f8;
  byte local_d2;
  byte local_d1;
  double local_d0;
  int local_c4;
  double local_c0;
  double local_b8;
  double local_b0;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
  *local_a8;
  
  local_b0 = 0.01;
  local_b8 = 0.08;
  local_c0 = 2.0;
  local_c4 = 0x32;
  local_d0 = 1e-05;
  local_d1 = 1;
  local_d2 = 0;
  local_a8 = in_R9;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xcf1ec0);
  local_f8 = 0.3;
  local_f9 = 0;
  local_100 = 0;
  do {
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffff410 >> 0x20);
    bVar8 = (local_f9 & 1) == 0;
    uVar16 = bVar8 && local_100 < 5;
    if (!bVar8 || local_100 >= 5) {
      pdVar14 = (double *)&stack0xffffffffffffff10;
      ge::composeG(in_stack_000018e0,in_stack_000018d8,in_stack_000018d0,in_stack_000018c8,
                   in_stack_000018c0,in_stack_000018f8,in_stack_00001900,in_stack_00001908,
                   in_stack_00001910,in_stack_00001918,in_stack_00001920,in_stack_00001928,
                   in_stack_00001930,in_stack_00001938,in_stack_00001940,in_stack_00001948);
      Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::
      EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>
                (in_stack_fffffffffffff428,in_stack_fffffffffffff420,(bool)in_stack_fffffffffffff41f
                );
      Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvalues(&local_7c0);
      Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>::Matrix
                ((Matrix<std::complex<double>,_4,_1,_0,_4,_1> *)in_stack_00000008,
                 (Matrix<std::complex<double>,_4,_1,_0,_4,_1> *)local_a8);
      Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
                (in_stack_fffffffffffff560);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0xcf2cb6);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0xcf2cc3);
      other = local_a8;
      pDVar12 = in_stack_00000008;
      for (local_9c8 = 0; local_9c8 < 4; local_9c8 = local_9c8 + 1) {
        this = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
               operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *)
                          pDVar12,(Index)other);
        dVar11 = std::complex<double>::real_abi_cxx11_(this);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)pDVar12,
                            (Index)other);
        *pSVar6 = dVar11;
        for (local_9d0 = 0; local_9d0 < 4; local_9d0 = local_9d0 + 1) {
          this_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>,_1>::
                    operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>,_1>
                                *)pDVar12,(Index)other,0xcf2d54);
          dVar11 = std::complex<double>::real_abi_cxx11_(this_00);
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)pDVar12,
                              (Index)other,0xcf2d7f);
          *pSVar7 = dVar11;
        }
      }
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)pDVar12,(Index)other,
                 0xcf2dd0);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
                ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)y1P,(Index)x1P);
      Eigen::operator*(pdVar14,(StorageBaseType *)m12P);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)pDVar12,other);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)pDVar12,(Matrix<double,_4,_1,_0,_4,_1> *)other);
      math::cayley2rot((cayley_t *)in_stack_fffffffffffff4f0);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)pDVar12,(Matrix<double,_3,_3,_0,_3,_3> *)other);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)pDVar12,(Matrix<double,_4,_1,_0,_4,_1> *)other);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::operator=
                ((Matrix<double,_4,_4,_0,_4,_4> *)pDVar12,(Matrix<double,_4,_4,_0,_4,_4> *)other);
      return;
    }
    if (2 < local_100) {
      local_f8 = 0.6;
    }
    if (local_100 == 0) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c0);
    }
    else {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xcf1f72);
      iVar1 = rand();
      in_stack_fffffffffffff510 =
           (Matrix<double,_9,_9,_0,_9,_9> *)(((double)iVar1 / 2147483647.0 - 0.5) * 2.0 * local_f8);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff3c8,(Index)in_stack_fffffffffffff3c0);
      *pSVar2 = (Scalar)in_stack_fffffffffffff510;
      iVar1 = rand();
      in_stack_fffffffffffff518 =
           (Matrix<double,_9,_9,_0,_9,_9> *)(((double)iVar1 / 2147483647.0 - 0.5) * 2.0 * local_f8);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff3c8,(Index)in_stack_fffffffffffff3c0);
      *pSVar2 = (Scalar)in_stack_fffffffffffff518;
      iVar1 = rand();
      in_stack_fffffffffffff520 =
           (cayley_t *)(((double)iVar1 / 2147483647.0 - 0.5) * 2.0 * local_f8);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff3c8,(Index)in_stack_fffffffffffff3c0);
      *pSVar2 = (Scalar)in_stack_fffffffffffff520;
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                (in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
    }
    local_b0 = 0.01;
    local_11c = 0;
    m22P_00 = (Matrix<double,_9,_9,_0,_9,_9> *)&stack0xffffffffffffff10;
    in_stack_fffffffffffff410 = (cayley_t *)CONCAT44(uVar15,1);
    in_stack_fffffffffffff3c0 = in_stack_00000008;
    in_stack_fffffffffffff3c8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)x1P;
    in_stack_fffffffffffff3e0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x2P;
    in_stack_fffffffffffff3e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)y2P;
    pDVar12 = in_stack_00000008;
    z2P_00 = x1P;
    local_128 = ge::getCost((Matrix3d *)in_stack_fffffffffffff498,
                            (Matrix3d *)in_stack_fffffffffffff490,
                            (Matrix3d *)in_stack_fffffffffffff488,
                            (Matrix3d *)in_stack_fffffffffffff480,
                            (Matrix3d *)in_stack_fffffffffffff478,
                            (Matrix3d *)in_stack_fffffffffffff470,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,
                            m22P_00,in_stack_fffffffffffff410,in_stack_fffffffffffff418);
    for (; local_11c < local_c4; local_11c = local_11c + 1) {
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)0xcf21b0);
      matrix = (StorageBaseType *)&stack0xffffffffffffff10;
      pdVar14 = local_140;
      in_stack_fffffffffffff418 = 1;
      this_01 = in_stack_00000008;
      this_02 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)x1P;
      other_00 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)y2P;
      pMVar13 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)z2P;
      ge::getQuickJacobian
                ((Matrix3d *)in_stack_fffffffffffff498,(Matrix3d *)in_stack_fffffffffffff490,
                 (Matrix3d *)in_stack_fffffffffffff488,(Matrix3d *)in_stack_fffffffffffff480,
                 (Matrix3d *)in_stack_fffffffffffff478,(Matrix3d *)in_stack_fffffffffffff470,
                 in_stack_fffffffffffff4d8,
                 (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_fffffffffffff4e0,
                 in_stack_fffffffffffff4e8,
                 (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_fffffffffffff4f0,
                 (Matrix<double,_3,_9,_0,_3,_9> *)pDVar12,z2P_00,m22P_00,in_stack_fffffffffffff510,
                 in_stack_fffffffffffff518,in_stack_fffffffffffff520,
                 (double)in_stack_fffffffffffff468,
                 (Matrix<double,_1,_3,_1,_1,_3> *)CONCAT17(uVar16,in_stack_fffffffffffff528),
                 in_stack_fffffffffffff530);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         (this_02,(Index)this_01);
      dVar11 = pow(*pSVar3,2.0);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         (this_02,(Index)this_01);
      dVar9 = pow(*pSVar3,2.0);
      in_stack_fffffffffffff4d8 = (Matrix<double,_3,_9,_0,_3,_9> *)(dVar11 + dVar9);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         (this_02,(Index)this_01);
      dVar11 = pow(*pSVar3,2.0);
      local_148 = sqrt((double)in_stack_fffffffffffff4d8 + dVar11);
      local_190 = 1.0 / local_148;
      local_198 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::transpose(this_01);
      Eigen::operator*(pdVar14,matrix);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,3,1,1,3>>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)this_02,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  *)this_01);
      Eigen::operator*(pdVar14,(StorageBaseType *)matrix);
      uVar15 = (undefined4)((ulong)pdVar14 >> 0x20);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(pMVar13,other_00);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)this_02,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)this_01);
      matrix_00 = local_1b0;
      in_stack_fffffffffffff410 = (cayley_t *)CONCAT44(uVar15,1);
      in_stack_fffffffffffff3c0 = in_stack_00000008;
      in_stack_fffffffffffff3c8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)x1P;
      in_stack_fffffffffffff3e0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x2P;
      in_stack_fffffffffffff3e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)y2P;
      pMVar13 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)z2P;
      in_stack_fffffffffffff4e0 = in_stack_00000008;
      in_stack_fffffffffffff4e8 = x1P;
      in_stack_fffffffffffff4f0 = matrix_00;
      local_218 = ge::getCost((Matrix3d *)in_stack_fffffffffffff498,
                              (Matrix3d *)in_stack_fffffffffffff490,
                              (Matrix3d *)in_stack_fffffffffffff488,
                              (Matrix3d *)in_stack_fffffffffffff480,
                              (Matrix3d *)in_stack_fffffffffffff478,
                              (Matrix3d *)in_stack_fffffffffffff470,x1P,y1P,z1P,x2P,y2P,z2P,m11P,
                              m12P,(Matrix<double,_9,_9,_0,_9,_9> *)matrix_00,
                              in_stack_fffffffffffff410,in_stack_fffffffffffff418);
      if ((local_d2 & 1) != 0) {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_11c);
        std::operator<<(poVar4,": ");
        local_220 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                               in_stack_fffffffffffff3c0);
        Eigen::operator<<(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
        poVar4 = std::operator<<((ostream *)&std::cout," lambda: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b0);
        poVar4 = std::operator<<(poVar4," EV: ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_218);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      if ((local_11c == 0) || ((local_d1 & 1) == 0)) {
        while ((local_218 < local_128 && (local_128 = local_218, local_b0 * local_c0 <= local_b8)))
        {
          local_b0 = local_c0 * local_b0;
          Eigen::operator*((double *)in_stack_fffffffffffff410,matrix_00);
          uVar15 = (undefined4)((ulong)in_stack_fffffffffffff410 >> 0x20);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                    (pMVar13,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)in_stack_fffffffffffff3e8);
          Eigen::Matrix<double,3,1,0,3,1>::operator=
                    ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                      *)in_stack_fffffffffffff3c0);
          matrix_00 = local_1b0;
          in_stack_fffffffffffff410 = (cayley_t *)CONCAT44(uVar15,1);
          in_stack_fffffffffffff3c0 = in_stack_00000008;
          in_stack_fffffffffffff3c8 =
               (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)x1P;
          in_stack_fffffffffffff3e0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x2P;
          in_stack_fffffffffffff3e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)y2P;
          pMVar13 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)z2P;
          in_stack_fffffffffffff490 = in_stack_00000008;
          in_stack_fffffffffffff498 = x1P;
          local_218 = ge::getCost((Matrix3d *)x1P,(Matrix3d *)in_stack_00000008,
                                  (Matrix3d *)in_stack_fffffffffffff488,
                                  (Matrix3d *)in_stack_fffffffffffff480,
                                  (Matrix3d *)in_stack_fffffffffffff478,
                                  (Matrix3d *)in_stack_fffffffffffff470,x1P,y1P,z1P,x2P,y2P,z2P,m11P
                                  ,m12P,(Matrix<double,_9,_9,_0,_9,_9> *)matrix_00,
                                  in_stack_fffffffffffff410,in_stack_fffffffffffff418);
          if ((local_d2 & 1) != 0) {
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_11c);
            in_stack_fffffffffffff488 = std::operator<<(poVar4,": ");
            local_288 = (non_const_type)
                        Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                   in_stack_fffffffffffff3c0);
            Eigen::operator<<(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
            poVar4 = std::operator<<((ostream *)&std::cout," lambda: ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b0);
            poVar4 = std::operator<<(poVar4," EV: ");
            pvVar5 = (void *)std::ostream::operator<<(poVar4,local_218);
            std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      while (local_128 < local_218) {
        local_b0 = local_b0 / local_c0;
        Eigen::operator*((double *)in_stack_fffffffffffff410,matrix_00);
        uVar15 = (undefined4)((ulong)in_stack_fffffffffffff410 >> 0x20);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  (pMVar13,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)in_stack_fffffffffffff3e8);
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                    *)in_stack_fffffffffffff3c0);
        matrix_00 = local_1b0;
        in_stack_fffffffffffff410 = (cayley_t *)CONCAT44(uVar15,1);
        in_stack_fffffffffffff3c0 = in_stack_00000008;
        in_stack_fffffffffffff3c8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)x1P;
        in_stack_fffffffffffff3e0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x2P;
        in_stack_fffffffffffff3e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)y2P;
        pMVar13 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)z2P;
        in_stack_fffffffffffff470 = in_stack_00000008;
        in_stack_fffffffffffff478 = x1P;
        in_stack_fffffffffffff480 = matrix_00;
        local_218 = ge::getCost((Matrix3d *)in_stack_fffffffffffff498,
                                (Matrix3d *)in_stack_fffffffffffff490,
                                (Matrix3d *)in_stack_fffffffffffff488,(Matrix3d *)matrix_00,
                                (Matrix3d *)x1P,(Matrix3d *)in_stack_00000008,x1P,y1P,z1P,x2P,y2P,
                                z2P,m11P,m12P,(Matrix<double,_9,_9,_0,_9,_9> *)matrix_00,
                                in_stack_fffffffffffff410,in_stack_fffffffffffff418);
        if ((local_d2 & 1) != 0) {
          poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_11c);
          in_stack_fffffffffffff468 = std::operator<<(poVar4,": ");
          local_2f0 = (non_const_type)
                      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                                ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                 in_stack_fffffffffffff3c0);
          Eigen::operator<<(in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          poVar4 = std::operator<<((ostream *)&std::cout," lambda: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b0);
          poVar4 = std::operator<<(poVar4," EV: ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,local_218);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
      }
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c0);
      local_128 = local_218;
      if (local_b0 < local_d0) break;
    }
    RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_fffffffffffff3c0);
    if (0.01 <= RVar10) {
      local_f9 = 1;
    }
    else {
      in_stack_fffffffffffff410 =
           (cayley_t *)((ulong)in_stack_fffffffffffff410 & 0xffffffff00000000);
      in_stack_fffffffffffff3c0 = in_stack_00000008;
      in_stack_fffffffffffff3c8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)x1P;
      in_stack_fffffffffffff3e0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x2P;
      in_stack_fffffffffffff3e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)y2P;
      local_2f8 = ge::getCost((Matrix3d *)in_stack_fffffffffffff498,
                              (Matrix3d *)in_stack_fffffffffffff490,
                              (Matrix3d *)in_stack_fffffffffffff488,
                              (Matrix3d *)in_stack_fffffffffffff480,
                              (Matrix3d *)in_stack_fffffffffffff478,
                              (Matrix3d *)in_stack_fffffffffffff470,x1P,y1P,z1P,x2P,y2P,z2P,m11P,
                              m12P,(Matrix<double,_9,_9,_0,_9,_9> *)&stack0xffffffffffffff10,
                              in_stack_fffffffffffff410,in_stack_fffffffffffff418);
      if (local_2f8 <= 0.001) {
        local_f9 = 1;
      }
      else {
        local_100 = local_100 + 1;
      }
    }
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::ge_main2(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //todo: the optimization strategy is something that can possibly be improved:
  //-one idea is to check the gradient at the new sampling point, if that derives
  // too much, we have to stop
  //-another idea consists of having linear change of lambda, instead of exponential (safer, but slower)
  
  double lambda = 0.01;
  double maxLambda = 0.08;
  double modifier = 2.0;
  int maxIterations = 50;
  double min_xtol = 0.00001;
  bool disablingIncrements = true;
  bool print = false;

  cayley_t cayley;
  
  double disturbanceAmplitude = 0.3;
  bool found = false;
  int randomTrialCount = 0;
  
  while( !found && randomTrialCount < 5 )
  {
    if(randomTrialCount > 2)
      disturbanceAmplitude = 0.6;
	
    if( randomTrialCount == 0 )
      cayley = startingPoint;
    else
    {
      cayley = startingPoint;
      Eigen::Vector3d disturbance;
      disturbance[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      cayley += disturbance;
    }
	
    lambda = 0.01;
    int iterations = 0;
    double smallestEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
        x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,1);
    
    while( iterations < maxIterations )
    {
      Eigen::Matrix<double,1,3> jacobian;
      ge::getQuickJacobian(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,smallestEV,jacobian,1);
      
      double norm = sqrt(pow(jacobian[0],2.0) + pow(jacobian[1],2.0) + pow(jacobian[2],2.0));
      cayley_t normalizedJacobian = (1/norm) * jacobian.transpose();
      
      cayley_t samplingPoint = cayley - lambda * normalizedJacobian;
      double samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
      
      if(print)
      {
        std::cout << iterations << ": " << samplingPoint.transpose();
        std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
      }
      
      if( iterations == 0 || !disablingIncrements )
      {
        while( samplingEV < smallestEV )
        {
          smallestEV = samplingEV;
          if( lambda * modifier > maxLambda )
            break;
          lambda *= modifier;
          samplingPoint = cayley - lambda * normalizedJacobian;
          samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
              x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
          
          if(print)
          {
            std::cout << iterations << ": " << samplingPoint.transpose();
            std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
          }
        }
      }
      
      while( samplingEV > smallestEV )
      {
        lambda /= modifier;
        samplingPoint = cayley - lambda * normalizedJacobian;
        samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
        
        if(print)
        {
          std::cout << iterations << ": " << samplingPoint.transpose();
          std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
        }
      }
      
      //apply update
      cayley = samplingPoint;
      smallestEV = samplingEV;
      
      //stopping condition (check if the update was too small)
      if( lambda < min_xtol )
        break;
      
      iterations++;
    }
    
    //try to see if we can robustly identify each time we enter up in the wrong minimum
    if( cayley.norm() < 0.01 )
    {
      //we are close to the origin, test the EV 2
      double ev2 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,0);
      if( ev2 > 0.001 )
        randomTrialCount++;
      else
        found = true;
    }
    else
      found = true;
  }
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = math::cayley2rot(cayley);
  output.eigenvalues = D;
  output.eigenvectors = V;
}